

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O2

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::set(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this,
     size_t begin,size_t end,word_type pattern)

{
  word_type wVar1;
  sbyte sVar2;
  byte bVar3;
  word_type value;
  ulong uVar4;
  ulong uVar5;
  size_t begin_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar6 = this->_width;
  uVar8 = (end - begin) * uVar6;
  uVar7 = 0x40 - 0x40U % uVar6;
  uVar4 = uVar8 % uVar7;
  wVar1 = this->_field_mask;
  begin_00 = begin * uVar6;
  while (begin_00 < uVar6 * end) {
    uVar5 = uVar4;
    if (uVar7 <= uVar8) {
      uVar5 = uVar7;
    }
    bVar3 = 0x40 - (-(char)uVar5 & 0x3fU);
    sVar2 = (bVar3 < 0x41) * ('@' - bVar3);
    value = (pattern * wVar1 << sVar2) >> sVar2;
    if (uVar5 == 0) {
      value = 0;
    }
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (&this->_bits,begin_00,uVar5 + begin_00,value);
    uVar8 = uVar8 - uVar5;
    begin_00 = uVar5 + begin_00;
    uVar6 = this->_width;
  }
  return;
}

Assistant:

void packed_view<C>::set(size_t begin, size_t end, word_type pattern)
        {
            size_t fields_per_word = W / width();
            size_t bits_per_word = fields_per_word * width(); // It's not useless
            size_t len = (end - begin) * width();
            size_t rem = len % bits_per_word;
            
            ensure_bitsize(pattern, width());
            
            word_type value = field_mask() * pattern;
            
            for(size_t step, p = begin * width();
                p < end * width();
                len -= step, p += step)
            {
                step = len < bits_per_word ? rem : bits_per_word;
                
                _bits.set(p, p + step, lowbits(value, step));
            }
        }